

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O0

float ncnn::sum_dim(vector<int,_std::allocator<int>_> *dim_sizes,int d,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tokens,vector<int,_std::allocator<int>_> *indexes)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  float fVar4;
  int i;
  float sum;
  size_t b;
  float v;
  vector<int,_std::allocator<int>_> *in_stack_00000150;
  string *in_stack_00000158;
  Mat *in_stack_00000160;
  int local_48;
  float local_44;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  float local_4;
  
  iVar5 = in_ESI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  if (in_ESI == (int)sVar1) {
    local_4 = 1.0;
    for (local_40 = 0; sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX),
        local_40 < sVar1; local_40 = local_40 + 1) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,local_40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RCX,local_40);
      fVar4 = get_indexed_value(in_stack_00000160,in_stack_00000158,in_stack_00000150);
      local_4 = fVar4 * local_4;
    }
  }
  else {
    local_44 = 0.0;
    for (local_48 = 0;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)iVar5),
        local_48 < *pvVar2; local_48 = local_48 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)iVar5);
      *pvVar3 = local_48;
      fVar4 = sum_dim((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffffe8)
                      ,(int)((ulong)in_RDX >> 0x20),in_RCX,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_R8,(vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_44 = fVar4 + local_44;
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

static float sum_dim(const std::vector<int>& dim_sizes, int d, const std::vector<Mat>& bottom_blobs, const std::vector<std::string>& tokens, std::vector<int>& indexes)
{
    if (d == (int)dim_sizes.size())
    {
        float v = 1.f;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            v *= get_indexed_value(bottom_blobs[b], tokens[b], indexes);
        }

        return v;
    }

    float sum = 0.f;

    for (int i = 0; i < dim_sizes[d]; i++)
    {
        indexes[d] = i;

        sum += sum_dim(dim_sizes, d + 1, bottom_blobs, tokens, indexes);
    }

    return sum;
}